

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::Jail(World *this,Command_Source *from,Character *victim,bool announce)

{
  Character *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  Character *local_220;
  byte local_202;
  allocator local_1b1;
  key_type local_1b0;
  allocator local_189;
  key_type local_188;
  allocator local_161;
  key_type local_160;
  Character *local_140;
  Character *charfrom;
  key_type local_130;
  byte local_10a;
  allocator local_109;
  undefined1 local_108 [6];
  bool bubbles;
  string local_e8;
  byte local_c2;
  allocator local_c1;
  _Hash_node<std::pair<const_IPAddress,_double>,_true> local_c0;
  _Hash_node<std::pair<const_IPAddress,_double>,_true> local_a0;
  allocator local_69;
  string local_68;
  string local_48;
  undefined1 local_21;
  Character *pCStack_20;
  bool announce_local;
  Character *victim_local;
  Command_Source *from_local;
  World *this_local;
  
  local_21 = announce;
  pCStack_20 = victim;
  victim_local = (Character *)from;
  from_local = (Command_Source *)this;
  if (announce) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"announce_removed",&local_69);
    (*(pCStack_20->super_Command_Source)._vptr_Command_Source[2])(&local_a0);
    local_c2 = 0;
    if (victim_local == (Character *)0x0) {
      std::allocator<char>::allocator();
      local_c2 = 1;
      std::__cxx11::string::string((string *)&local_c0,"server",&local_c1);
    }
    else {
      (*(victim_local->super_Command_Source)._vptr_Command_Source[2])(&local_c0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_108,"jailed",&local_109);
    I18N::Format<>(&local_e8,&this->i18n,(string *)local_108);
    I18N::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (&local_48,&this->i18n,&local_68,&local_a0,&local_c0,&local_e8);
    ServerMsg(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::~string((string *)&local_c0);
    if ((local_c2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_130,"WarpBubbles",(allocator *)((long)&charfrom + 7));
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_130);
  bVar1 = util::variant::operator_cast_to_bool(pmVar5);
  local_202 = 0;
  if (bVar1) {
    bVar1 = Character::IsHideWarp(pCStack_20);
    local_202 = bVar1 ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&charfrom + 7));
  local_10a = local_202 & 1;
  if (victim_local == (Character *)0x0) {
    local_220 = (Character *)0x0;
  }
  else {
    local_220 = (Character *)
                __dynamic_cast(victim_local,&Command_Source::typeinfo,&Character::typeinfo,0);
  }
  local_140 = local_220;
  if ((local_220 != (Character *)0x0) && (bVar1 = Character::IsHideWarp(local_220), bVar1)) {
    local_10a = 0;
  }
  this_00 = pCStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"JailMap",&local_161);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_160);
  iVar2 = util::variant::operator_cast_to_int(pmVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"JailX",&local_189);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_188);
  iVar3 = util::variant::operator_cast_to_int(pmVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"JailY",&local_1b1);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_1b0);
  iVar4 = util::variant::operator_cast_to_int(pmVar5);
  Character::Warp(this_00,(short)iVar2,(uchar)iVar3,(uchar)iVar4,(local_10a & 1) * '\x02');
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  return;
}

Assistant:

void World::Jail(Command_Source *from, Character *victim, bool announce)
{
	if (announce)
		this->ServerMsg(i18n.Format("announce_removed", victim->SourceName(), from ? from->SourceName() : "server", i18n.Format("jailed")));

	bool bubbles = this->config["WarpBubbles"] && !victim->IsHideWarp();

	Character* charfrom = dynamic_cast<Character*>(from);

	if (charfrom && charfrom->IsHideWarp())
		bubbles = false;

	victim->Warp(static_cast<int>(this->config["JailMap"]), static_cast<int>(this->config["JailX"]), static_cast<int>(this->config["JailY"]), bubbles ? WARP_ANIMATION_ADMIN : WARP_ANIMATION_NONE);
}